

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfZip.cpp
# Opt level: O2

void Imf_3_4::anon_unknown_0::interleave_scalar(char *source,size_t outSize,char *out)

{
  char *pcVar1;
  char *pcVar2;
  char *t1;
  
  pcVar2 = out + outSize;
  while( true ) {
    if (pcVar2 <= out) {
      return;
    }
    *out = *source;
    if (pcVar2 <= out + 1) break;
    pcVar1 = source + (outSize + 1 >> 1);
    source = source + 1;
    out[1] = *pcVar1;
    out = out + 2;
  }
  return;
}

Assistant:

void
interleave_scalar (const char* source, size_t outSize, char* out)
{
    const char* t1   = source;
    const char* t2   = source + (outSize + 1) / 2;
    char*       s    = out;
    char* const stop = s + outSize;

    while (true)
    {
        if (s < stop)
            *(s++) = *(t1++);
        else
            break;

        if (s < stop)
            *(s++) = *(t2++);
        else
            break;
    }
}